

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O1

void tt_glyphzone_done(TT_GlyphZone zone)

{
  FT_Memory memory;
  
  memory = zone->memory;
  if (memory != (FT_Memory)0x0) {
    ft_mem_free(memory,zone->contours);
    zone->contours = (FT_UShort *)0x0;
    ft_mem_free(memory,zone->tags);
    zone->tags = (FT_Byte *)0x0;
    ft_mem_free(memory,zone->cur);
    zone->cur = (FT_Vector *)0x0;
    ft_mem_free(memory,zone->org);
    zone->org = (FT_Vector *)0x0;
    ft_mem_free(memory,zone->orus);
    zone->orus = (FT_Vector *)0x0;
    zone->memory = (FT_Memory)0x0;
    zone->max_points = 0;
    zone->max_contours = 0;
    zone->n_points = 0;
    zone->n_contours = 0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_glyphzone_done( TT_GlyphZone  zone )
  {
    FT_Memory  memory = zone->memory;


    if ( memory )
    {
      FT_FREE( zone->contours );
      FT_FREE( zone->tags );
      FT_FREE( zone->cur );
      FT_FREE( zone->org );
      FT_FREE( zone->orus );

      zone->max_points   = zone->n_points   = 0;
      zone->max_contours = zone->n_contours = 0;
      zone->memory       = NULL;
    }
  }